

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

void fe_write_frame(fe_t *fe,mfcc_t *feat,int32 store_pcm)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  double *pdVar5;
  frame_t *pfVar6;
  frame_t *pfVar7;
  powspec_t *ppVar8;
  melfb_t *pmVar9;
  powspec_t *ppVar10;
  int16 *piVar11;
  int16 *piVar12;
  int16 *piVar13;
  mfcc_t *pmVar14;
  mfcc_t *pmVar15;
  powspec_t *spec;
  long lVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  double *pdVar20;
  uint uVar21;
  double *pdVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  int32 is_speech;
  int32 local_6c;
  mfcc_t *local_68;
  fe_t *local_60;
  ulong local_58;
  double *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  pdVar5 = (double *)fe->frame;
  bVar1 = fe->fft_order;
  sVar2 = fe->fft_size;
  uVar21 = (uint)sVar2;
  local_58 = (ulong)uVar21;
  uVar29 = (ulong)(int)uVar21;
  if (1 < (int)uVar21) {
    uVar19 = 0;
    iVar24 = 0;
    do {
      lVar23 = (long)iVar24;
      uVar26 = uVar21;
      if ((long)uVar19 < lVar23) {
        dVar30 = pdVar5[lVar23];
        pdVar5[lVar23] = pdVar5[uVar19];
        pdVar5[uVar19] = dVar30;
      }
      do {
        iVar27 = iVar24;
        uVar26 = (int)uVar26 / 2;
        iVar24 = iVar27 - uVar26;
      } while ((int)uVar26 <= iVar27);
      iVar24 = iVar27 + uVar26;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar21 - 1);
  }
  if (0 < sVar2) {
    uVar19 = 0;
    do {
      dVar30 = pdVar5[uVar19];
      pdVar5[uVar19] = dVar30 + pdVar5[uVar19 + 1];
      pdVar5[uVar19 + 1] = dVar30 - pdVar5[uVar19 + 1];
      uVar19 = uVar19 + 2;
    } while (uVar19 < uVar29);
  }
  if (1 < bVar1) {
    uVar26 = 1;
    do {
      uVar18 = uVar26 + 1;
      if (0 < sVar2) {
        bVar17 = (byte)uVar26;
        iVar24 = 1 << (bVar17 & 0x1f);
        uVar25 = 1 << (bVar17 - 1 & 0x1f);
        uVar26 = 2 << (bVar17 & 0x1f);
        local_38 = (ulong)uVar26;
        local_40 = (long)(int)uVar26;
        local_48 = (long)iVar24;
        local_50 = pdVar5 + (int)uVar25;
        pdVar22 = pdVar5 + local_48;
        lVar28 = (ulong)(iVar24 * 2 - 2) + 1;
        lVar23 = 0;
        pdVar20 = pdVar5;
        do {
          lVar16 = local_48 + lVar23;
          dVar30 = pdVar5[lVar23];
          dVar31 = pdVar5[lVar16];
          pdVar5[lVar23] = dVar30 + dVar31;
          pdVar5[lVar16] = dVar30 - dVar31;
          local_50[lVar16] = -local_50[lVar16];
          if (1 < (int)uVar25) {
            pfVar6 = fe->ccc;
            pfVar7 = fe->sss;
            uVar19 = 1;
            lVar16 = 0;
            do {
              iVar24 = (int)uVar19 << (bVar1 - (char)uVar18 & 0x1f);
              iVar27 = (int)lVar28 + (int)lVar16;
              dVar32 = pdVar22[uVar19] * (double)pfVar6[iVar24] +
                       (double)pfVar7[iVar24] * pdVar5[iVar27];
              dVar31 = pdVar22[uVar19] * (double)pfVar7[iVar24] -
                       (double)pfVar6[iVar24] * pdVar5[iVar27];
              dVar30 = pdVar22[lVar16 + -1];
              pdVar5[iVar27] = dVar30 - dVar31;
              pdVar22[uVar19] = -dVar30 - dVar31;
              pdVar22[lVar16 + -1] = pdVar20[uVar19] - dVar32;
              pdVar20[uVar19] = dVar32 + pdVar20[uVar19];
              uVar19 = uVar19 + 1;
              lVar16 = lVar16 + -1;
            } while (uVar25 != uVar19);
          }
          lVar23 = lVar23 + local_40;
          pdVar20 = pdVar20 + local_40;
          pdVar22 = pdVar22 + local_40;
          lVar28 = lVar28 + local_38;
        } while (lVar23 < (long)uVar29);
      }
      uVar26 = uVar18;
    } while (bVar1 != uVar18);
  }
  ppVar8 = fe->spec;
  *ppVar8 = (powspec_t)(*pdVar5 * *pdVar5);
  if (1 < sVar2) {
    pdVar22 = pdVar5 + uVar29;
    lVar23 = 0;
    do {
      pdVar22 = pdVar22 + -1;
      ppVar8[lVar23 + 1] =
           (powspec_t)(pdVar5[lVar23 + 1] * pdVar5[lVar23 + 1] + *pdVar22 * *pdVar22);
      lVar23 = lVar23 + 1;
    } while ((ulong)(uVar21 >> 1) + (ulong)((ulong)(uVar21 >> 1) == 0) != lVar23);
  }
  pmVar9 = fe->mel_fb;
  iVar24 = pmVar9->num_filters;
  if (0 < (long)iVar24) {
    ppVar10 = fe->mfspec;
    piVar11 = pmVar9->spec_start;
    piVar12 = pmVar9->filt_start;
    piVar13 = pmVar9->filt_width;
    lVar23 = 0;
    do {
      sVar2 = piVar11[lVar23];
      sVar3 = piVar12[lVar23];
      ppVar10[lVar23] = 0.0;
      sVar4 = piVar13[lVar23];
      if (0 < (long)sVar4) {
        pmVar14 = pmVar9->filt_coeffs;
        dVar30 = 0.0;
        lVar28 = 0;
        do {
          dVar30 = dVar30 + (double)(float)pmVar14[sVar3 + lVar28] * (double)ppVar8[sVar2 + lVar28];
          ppVar10[lVar23] = (powspec_t)dVar30;
          lVar28 = lVar28 + 1;
        } while (sVar4 != lVar28);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != iVar24);
  }
  local_68 = feat;
  local_60 = fe;
  fe_track_snr(fe,&local_6c);
  ppVar8 = fe->mfspec;
  if (0 < fe->mel_fb->num_filters) {
    lVar23 = 0;
    do {
      dVar30 = log((double)ppVar8[lVar23] + 0.0001);
      ppVar8[lVar23] = (powspec_t)dVar30;
      lVar23 = lVar23 + 1;
    } while (lVar23 < fe->mel_fb->num_filters);
  }
  pmVar14 = local_68;
  if (fe->log_spec == '\x02') {
    fe_dct2(fe,ppVar8,local_68,0);
    fe_dct3(fe,pmVar14,ppVar8);
    bVar1 = fe->feature_dimension;
    if ((ulong)bVar1 != 0) {
      uVar29 = 0;
      do {
        pmVar14[uVar29] = (mfcc_t)(float)(double)ppVar8[uVar29];
        uVar29 = uVar29 + 1;
      } while (bVar1 != uVar29);
    }
  }
  else if (fe->log_spec == '\x01') {
    bVar1 = fe->feature_dimension;
    if ((ulong)bVar1 != 0) {
      uVar29 = 0;
      do {
        local_68[uVar29] = (mfcc_t)(float)(double)ppVar8[uVar29];
        uVar29 = uVar29 + 1;
      } while (bVar1 != uVar29);
    }
  }
  else {
    if (fe->transform == '\x02') {
      iVar24 = 1;
    }
    else {
      if (fe->transform != '\x01') {
        fe_spec2cep(fe,ppVar8,local_68);
        goto LAB_00136faf;
      }
      iVar24 = 0;
    }
    fe_dct2(fe,ppVar8,local_68,iVar24);
  }
LAB_00136faf:
  if ((fe->mel_fb->lifter_val != 0) && (bVar1 = fe->num_cepstra, (ulong)bVar1 != 0)) {
    pmVar15 = fe->mel_fb->lifter;
    uVar29 = 0;
    do {
      pmVar14[uVar29] = (mfcc_t)((float)pmVar14[uVar29] * (float)pmVar15[uVar29]);
      uVar29 = uVar29 + 1;
    } while (bVar1 != uVar29);
  }
  fe_vad_hangover(fe,pmVar14,local_6c,store_pcm);
  return;
}

Assistant:

void
fe_write_frame(fe_t * fe, mfcc_t * feat, int32 store_pcm)
{
    int32 is_speech;

    fe_spec_magnitude(fe);
    fe_mel_spec(fe);
    fe_track_snr(fe, &is_speech);
    fe_mel_cep(fe, feat);
    fe_lifter(fe, feat);
    fe_vad_hangover(fe, feat, is_speech, store_pcm);
}